

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  undefined8 *puVar5;
  long *plVar6;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long *plVar7;
  stringstream *psVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  char *pcVar12;
  ulong uVar13;
  undefined8 uVar14;
  ostream *poVar15;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  int local_13c;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined8 local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [32];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  long local_68;
  undefined1 local_60 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50 [2];
  ulong local_40;
  undefined8 uStack_38;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                       ,0x464);
    Message::Message((Message *)local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50[0]._M_head_impl)->field_0x10,
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50[0]._M_head_impl)->field_0x10,
               " in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50[0]._M_head_impl)->field_0x10,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50[0]._M_head_impl)->field_0x10," ",1);
    poVar15 = (ostream *)&(local_50[0]._M_head_impl)->field_0x10;
    if (sVar3 == 0) {
      lVar11 = 0x26;
      pcVar12 = "couldn\'t detect the number of threads.";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_50[0]._M_head_impl)->field_0x10);
      poVar15 = (ostream *)&(local_50[0]._M_head_impl)->field_0x10;
      lVar11 = 9;
      pcVar12 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar12,lVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50[0]._M_head_impl)->field_0x10,
               " See https://github.com/google/googletest/blob/master/docs/advanced.md#death-tests-and-threads"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50[0]._M_head_impl)->field_0x10,
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50[0]._M_head_impl)->field_0x10,
               " this is the last message you see before your test times out.",0x3d);
    StringStreamToString((string *)local_b0,local_50[0]._M_head_impl);
    if (local_50[0]._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_50[0]._M_head_impl + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)local_b0._0_8_,local_b0._8_8_);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10)
       ) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_90);
  }
  iVar1 = pipe(&local_138);
  if (iVar1 == -1) {
    pbVar18 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    local_110 = pbVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
    local_d0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    pbVar16 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if (local_d0 == pbVar16) {
      local_c0._0_8_ = *(undefined8 *)pbVar16;
      local_c0._8_8_ = puVar5[3];
      local_d0 = pbVar19;
    }
    else {
      local_c0._0_8_ = *(undefined8 *)pbVar16;
    }
    local_c8 = puVar5[1];
    *puVar5 = pbVar16;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    pbVar16 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    pbVar17 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if (local_70._M_head_impl == pbVar17) {
      local_60._0_8_ = *(undefined8 *)pbVar17;
      local_60._8_8_ = puVar5[3];
      local_70._M_head_impl = pbVar16;
    }
    else {
      local_60._0_8_ = *(undefined8 *)pbVar17;
    }
    local_68 = puVar5[1];
    *puVar5 = pbVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    pipe_fd[0] = 0x468;
    StreamableToString<int>((string *)local_f0,pipe_fd);
    uVar13 = 0xf;
    if (local_70._M_head_impl != pbVar16) {
      uVar13 = local_60._0_8_;
    }
    if (uVar13 < (ulong)(local_f0._8_8_ + local_68)) {
      uVar13 = 0xf;
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        uVar13 = local_f0._16_8_;
      }
      _Var9._M_head_impl = local_70._M_head_impl;
      if ((ulong)(local_f0._8_8_ + local_68) <= uVar13) goto LAB_0015b11d;
    }
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,local_f0._0_8_);
LAB_0015b12d:
    local_90 = (long *)*puVar5;
    plVar6 = puVar5 + 2;
    if (local_90 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = puVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
    }
    local_88 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    pbVar17 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffc0;
    local_50[0]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if (local_50[0]._M_head_impl == pbVar10) {
      local_40 = *(ulong *)pbVar10;
      uStack_38 = puVar5[3];
      local_50[0]._M_head_impl = pbVar17;
    }
    else {
      local_40 = *(ulong *)pbVar10;
    }
    local_50[1]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5[1];
    *puVar5 = pbVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
    local_b0._0_8_ = *puVar5;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ ==
        pbVar10) {
      local_b0._16_8_ = *(undefined8 *)pbVar10;
      local_b0._24_8_ = puVar5[3];
      local_b0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_b0 + 0x10);
    }
    else {
      local_b0._16_8_ = *(undefined8 *)pbVar10;
    }
    local_b0._8_8_ = puVar5[1];
    *puVar5 = pbVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    DeathTestAbort((string *)local_b0);
    puVar5 = extraout_RAX_00;
    local_b0._0_8_ = extraout_RDX_00;
  }
  else {
    pbVar18 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_b0 + 0x10);
    local_b0._0_8_ = pbVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
        pbVar18) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var2;
      if (_Var2 == 0) {
        do {
          iVar1 = close(local_138);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_134;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_f0._0_8_ = local_f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CHECK failed: File ","")
        ;
        puVar5 = (undefined8 *)std::__cxx11::string::append(local_f0);
        local_110 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    *puVar5;
        pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (puVar5 + 2);
        if (local_110 == pbVar19) {
          local_100._0_8_ = *(undefined8 *)pbVar19;
          local_100._8_8_ = puVar5[3];
          local_110 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_100;
        }
        else {
          local_100._0_8_ = *(undefined8 *)pbVar19;
        }
        local_108 = puVar5[1];
        *puVar5 = pbVar19;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        local_d0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   *puVar5;
        pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (puVar5 + 2);
        if (local_d0 == pbVar19) {
          local_c0._0_8_ = *(undefined8 *)pbVar19;
          local_c0._8_8_ = puVar5[3];
          local_d0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c0;
        }
        else {
          local_c0._0_8_ = *(undefined8 *)pbVar19;
        }
        local_c8 = puVar5[1];
        *puVar5 = pbVar19;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        local_13c = 0x479;
        StreamableToString<int>((string *)pipe_fd,&local_13c);
        uVar13 = 0xf;
        if (local_d0 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0) {
          uVar13 = local_c0._0_8_;
        }
        if (uVar13 < local_128 + local_c8) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
            uVar14 = local_120._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_128 + local_c8) goto LAB_0015ac1f;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0);
        }
        else {
LAB_0015ac1f:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d0,CONCAT44(pipe_fd[1],pipe_fd[0]));
        }
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
        pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (puVar5 + 2);
        if (local_70._M_head_impl == pbVar19) {
          local_60._0_8_ = *(undefined8 *)pbVar19;
          local_60._8_8_ = puVar5[3];
          local_70._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
        }
        else {
          local_60._0_8_ = *(undefined8 *)pbVar19;
        }
        local_68 = puVar5[1];
        *puVar5 = pbVar19;
        puVar5[1] = 0;
        *(undefined1 *)pbVar19 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
        local_90 = (long *)*puVar5;
        plVar6 = puVar5 + 2;
        if (local_90 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = puVar5[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar6;
        }
        local_88 = puVar5[1];
        *puVar5 = plVar6;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        local_50[0]._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
        psVar8 = (stringstream *)(puVar5 + 2);
        if (local_50[0]._M_head_impl == psVar8) {
          local_40 = *(ulong *)psVar8;
          uStack_38 = puVar5[3];
          local_50[0]._M_head_impl = (stringstream *)&stack0xffffffffffffffc0;
        }
        else {
          local_40 = *(ulong *)psVar8;
        }
        local_50[1]._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5[1];
        *puVar5 = psVar8;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
        local_b0._0_8_ = *puVar5;
        _Var9._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar5 + 2)
        ;
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_b0._0_8_ != _Var9._M_head_impl) goto LAB_0015b0e9;
        local_b0._16_8_ = *(undefined8 *)_Var9._M_head_impl;
        local_b0._24_8_ = puVar5[3];
        local_b0._0_8_ = pbVar18;
      }
      else {
        do {
          iVar1 = close(local_134);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_f0._0_8_ = local_f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CHECK failed: File ","")
        ;
        puVar5 = (undefined8 *)std::__cxx11::string::append(local_f0);
        local_110 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    *puVar5;
        pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (puVar5 + 2);
        if (local_110 == pbVar19) {
          local_100._0_8_ = *(undefined8 *)pbVar19;
          local_100._8_8_ = puVar5[3];
          local_110 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_100;
        }
        else {
          local_100._0_8_ = *(undefined8 *)pbVar19;
        }
        local_108 = puVar5[1];
        *puVar5 = pbVar19;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        local_d0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   *puVar5;
        pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (puVar5 + 2);
        if (local_d0 == pbVar19) {
          local_c0._0_8_ = *(undefined8 *)pbVar19;
          local_c0._8_8_ = puVar5[3];
          local_d0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c0;
        }
        else {
          local_c0._0_8_ = *(undefined8 *)pbVar19;
        }
        local_c8 = puVar5[1];
        *puVar5 = pbVar19;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        local_13c = 0x485;
        StreamableToString<int>((string *)pipe_fd,&local_13c);
        uVar13 = 0xf;
        if (local_d0 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0) {
          uVar13 = local_c0._0_8_;
        }
        if (uVar13 < local_128 + local_c8) {
          uVar14 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
            uVar14 = local_120._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_128 + local_c8) goto LAB_0015aaac;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0);
        }
        else {
LAB_0015aaac:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d0,CONCAT44(pipe_fd[1],pipe_fd[0]));
        }
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
        pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (puVar5 + 2);
        if (local_70._M_head_impl == pbVar19) {
          local_60._0_8_ = *(undefined8 *)pbVar19;
          local_60._8_8_ = puVar5[3];
          local_70._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
        }
        else {
          local_60._0_8_ = *(undefined8 *)pbVar19;
        }
        local_68 = puVar5[1];
        *puVar5 = pbVar19;
        puVar5[1] = 0;
        *(undefined1 *)pbVar19 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_90 = (long *)*plVar6;
        plVar7 = plVar6 + 2;
        if (local_90 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar6[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        local_50[0]._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
        psVar8 = (stringstream *)(puVar5 + 2);
        if (local_50[0]._M_head_impl == psVar8) {
          local_40 = *(ulong *)psVar8;
          uStack_38 = puVar5[3];
          local_50[0]._M_head_impl = (stringstream *)&stack0xffffffffffffffc0;
        }
        else {
          local_40 = *(ulong *)psVar8;
        }
        local_50[1]._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5[1];
        *puVar5 = psVar8;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
        local_b0._0_8_ = *puVar5;
        _Var9._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar5 + 2)
        ;
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_b0._0_8_ == _Var9._M_head_impl) {
          local_b0._16_8_ = *(undefined8 *)_Var9._M_head_impl;
          local_b0._24_8_ = puVar5[3];
          local_b0._0_8_ = pbVar18;
        }
        else {
          local_b0._16_8_ = *(undefined8 *)_Var9._M_head_impl;
        }
        local_b0._8_8_ = puVar5[1];
        *puVar5 = _Var9._M_head_impl;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        DeathTestAbort((string *)local_b0);
        puVar5 = extraout_RAX;
        local_b0._0_8_ = extraout_RDX;
LAB_0015b0e9:
        local_b0._16_8_ = *(undefined8 *)_Var9._M_head_impl;
      }
      pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_f0 + 0x10);
      pbVar16 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100
      ;
      local_b0._8_8_ = puVar5[1];
      *puVar5 = _Var9._M_head_impl;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      DeathTestAbort((string *)local_b0);
LAB_0015b11d:
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_f0,0,(char *)0x0,(ulong)_Var9._M_head_impl);
      goto LAB_0015b12d;
    }
    pbVar19 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    local_110 = pbVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    pbVar16 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
    local_d0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    pbVar17 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if (local_d0 == pbVar17) {
      local_c0._0_8_ = *(undefined8 *)pbVar17;
      local_c0._8_8_ = puVar5[3];
      local_d0 = pbVar16;
    }
    else {
      local_c0._0_8_ = *(undefined8 *)pbVar17;
    }
    local_c8 = puVar5[1];
    *puVar5 = pbVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    pbVar17 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if (local_70._M_head_impl == pbVar10) {
      local_60._0_8_ = *(undefined8 *)pbVar10;
      local_60._8_8_ = puVar5[3];
      local_70._M_head_impl = pbVar17;
    }
    else {
      local_60._0_8_ = *(undefined8 *)pbVar10;
    }
    local_68 = puVar5[1];
    *puVar5 = pbVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    pipe_fd[0] = 0x476;
    StreamableToString<int>((string *)local_f0,pipe_fd);
    uVar13 = 0xf;
    if (local_70._M_head_impl != pbVar17) {
      uVar13 = local_60._0_8_;
    }
    if (uVar13 < (ulong)(local_f0._8_8_ + local_68)) {
      uVar13 = 0xf;
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        uVar13 = local_f0._16_8_;
      }
      if (uVar13 < (ulong)(local_f0._8_8_ + local_68)) goto LAB_0015b04f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_f0,0,(char *)0x0,(ulong)local_70._M_head_impl);
    }
    else {
LAB_0015b04f:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,local_f0._0_8_);
    }
    local_90 = (long *)*puVar5;
    plVar6 = puVar5 + 2;
    if (local_90 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = puVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
    }
    local_88 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_50[0]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if (local_50[0]._M_head_impl == pbVar10) {
      local_40 = *(ulong *)pbVar10;
      uStack_38 = puVar5[3];
      local_50[0]._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffc0;
    }
    else {
      local_40 = *(ulong *)pbVar10;
    }
    local_50[1]._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5[1];
    *puVar5 = pbVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
    local_b0._0_8_ = *puVar5;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar5 + 2);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ ==
        pbVar10) {
      local_b0._16_8_ = *(undefined8 *)pbVar10;
      local_b0._24_8_ = puVar5[3];
      local_b0._0_8_ = pbVar18;
      goto LAB_0015b32b;
    }
  }
  local_b0._16_8_ = *(undefined8 *)pbVar10;
LAB_0015b32b:
  local_b0._8_8_ = puVar5[1];
  *puVar5 = pbVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort((string *)local_b0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0._0_8_ !=
      pbVar18) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (local_50[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      &stack0xffffffffffffffc0) {
    operator_delete(local_50[0]._M_head_impl,local_40 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if (local_70._M_head_impl != pbVar17) {
    operator_delete(local_70._M_head_impl,local_60._0_8_ + 1);
  }
  if (local_d0 != pbVar16) {
    operator_delete(local_d0,local_c0._0_8_ + 1);
  }
  if (local_110 != pbVar19) {
    operator_delete(local_110,local_100._0_8_ + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}